

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * __thiscall
capnp::Orphan<capnp::DynamicStruct>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicStruct> *this)

{
  RawBrandedSchema *pRVar1;
  StructSize size;
  StructSchema unaff_RBX;
  
  pRVar1 = (this->schema).super_Schema.raw;
  size = anon_unknown_71::structSizeFromSchema(unaff_RBX);
  capnp::_::OrphanBuilder::asStruct(&__return_storage_ptr__->builder,&this->builder,size);
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  return __return_storage_ptr__;
}

Assistant:

DynamicStruct::Builder Orphan<DynamicStruct>::get() {
  return DynamicStruct::Builder(schema, builder.asStruct(structSizeFromSchema(schema)));
}